

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.cpp
# Opt level: O1

void CovarianceTexture(int x,int y)

{
  Covariance4D<Vector,_double> *cov;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  double *pdVar7;
  Cov4D *pCVar8;
  long lVar9;
  uint uVar10;
  byte bVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar18;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  float fVar24;
  double dVar25;
  double dVar26;
  double sxy;
  double syy;
  double sxx;
  PosCov surfCov;
  Cov4D pixelCov;
  int local_28c;
  Vector local_268;
  Vector local_248;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  double dStack_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  undefined1 local_198 [16];
  double local_188;
  PosCov local_178;
  Cov4D local_c8;
  
  bVar11 = 0;
  auVar13._0_8_ = (double)x + 0.5;
  auVar13._8_8_ = (double)y + 0.5;
  auVar20._0_8_ = (double)width;
  auVar20._8_8_ = (double)height;
  auVar14 = divpd(auVar13,auVar20);
  dVar12 = auVar14._0_8_ + -0.5;
  dVar18 = auVar14._8_8_ + -0.5;
  dVar22 = cy.z * dVar18 + cx.z * dVar12 + cam.d.z;
  auVar14._0_8_ = cam.d.x + dVar18 * cy.x + dVar12 * cx.x;
  auVar14._8_8_ = cam.d.y + dVar18 * cy.y + dVar12 * cx.y;
  dVar12 = dVar22 * dVar22 + auVar14._0_8_ * auVar14._0_8_ + auVar14._8_8_ * auVar14._8_8_;
  if (dVar12 < 0.0) {
    local_208 = auVar14;
    dVar12 = sqrt(dVar12);
    auVar14 = local_208;
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  local_188 = dVar22 / dVar12;
  auVar15._8_8_ = dVar12;
  auVar15._0_8_ = dVar12;
  local_198 = divpd(auVar14,auVar15);
  pdVar7 = (double *)&DAT_0011e6e8;
  pCVar8 = &local_c8;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pCVar8->matrix)._M_elems[0] = *pdVar7;
    pdVar7 = pdVar7 + (ulong)bVar11 * -2 + 1;
    pCVar8 = (Cov4D *)((long)pCVar8 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  local_c8.y.y = 0.0;
  local_c8.y.z = 0.0;
  local_c8.x.z = 0.0;
  local_c8.y.x = 0.0;
  local_c8.x.x = 0.0;
  local_c8.x.y = 0.0;
  local_c8.z.x = (double)local_198._0_8_;
  local_c8.z.y = (double)local_198._8_8_;
  local_c8.z.z = local_188;
  Vector::Frame((Vector *)local_198,&local_c8.x,&local_c8.y);
  pdVar7 = &local_178.first.z;
  local_178.first.x = (double)pdVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
  std::__cxx11::stringbuf::str((string *)(sout_abi_cxx11_ + 0x18));
  if ((double *)local_178.first.x != pdVar7) {
    operator_delete((void *)local_178.first.x,(long)local_178.first.z + 1);
  }
  local_1f8._16_8_ = cam.o.z;
  local_1f8._0_8_ = cam.o.x;
  local_1f8._8_8_ = cam.o.y;
  stack0xfffffffffffffe20 = local_198;
  local_1d0 = local_188;
  CovarianceFilter(&local_178,&spheres,(Ray *)local_1f8,&local_c8,0,1,
                   (stringstream *)sout_abi_cxx11_);
  cov = &local_178.second;
  operator<<((ostream *)(sout_abi_cxx11_ + 0x10),cov);
  std::ios::widen((char)*(undefined8 *)(sout_abi_cxx11_._16_8_ + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(sout_abi_cxx11_ + 0x10),"Volume = ",9);
  dVar12 = Covariance::Covariance4D<Vector,_double>::Volume(cov);
  poVar5 = std::ostream::_M_insert<double>(dVar12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(sout_abi_cxx11_._16_8_ + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  local_210 = 0.0;
  local_218 = 0.0;
  local_220 = 0.0;
  local_248.z = 0.0;
  local_248.x = 0.0;
  local_248.y = 0.0;
  local_268.z = 0.0;
  local_268.x = 0.0;
  local_268.y = 0.0;
  Covariance::Covariance4D<Vector,_double>::SpatialFilter(cov,&local_210,&local_220,&local_218);
  Covariance::Covariance4D<Vector,_double>::SpatialExtent(cov,&local_248,&local_268);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(sout_abi_cxx11_ + 0x10),"Spatial filter = [",0x12);
  poVar5 = std::ostream::_M_insert<double>(local_210);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
  poVar5 = std::ostream::_M_insert<double>(local_220);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"; ",2);
  poVar5 = std::ostream::_M_insert<double>(local_220);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = std::ostream::_M_insert<double>(local_218);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(sout_abi_cxx11_ + 0x10),"Extent = ",9);
  poVar5 = operator<<((ostream *)(sout_abi_cxx11_ + 0x10),&local_248);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = operator<<(poVar5,&local_268);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(sout_abi_cxx11_ + 0x10),"|Dx| = ",7);
  dVar12 = local_248.z * local_248.z + local_248.x * local_248.x + local_248.y * local_248.y;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  poVar5 = std::ostream::_M_insert<double>(dVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", |Dy| = ",9);
  dVar12 = local_268.z * local_268.z + local_268.x * local_268.x + local_268.y * local_268.y;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  poVar5 = std::ostream::_M_insert<double>(dVar12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (0 < height) {
    local_28c = 0;
    do {
      if (0 < width) {
        local_208._8_8_ = 0;
        local_208._0_8_ = (double)local_28c + 0.5;
        uVar10 = 0;
        do {
          iVar2 = height;
          iVar1 = width;
          auVar16._0_8_ = (double)(int)uVar10 + 0.5;
          auVar16._8_8_ = local_208._0_8_;
          auVar21._0_8_ = (double)width;
          auVar21._8_8_ = (double)height;
          auVar14 = divpd(auVar16,auVar21);
          dVar12 = auVar14._0_8_ + -0.5;
          dVar18 = auVar14._8_8_ + -0.5;
          dVar22 = cy.z * dVar18 + cx.z * dVar12 + cam.d.z;
          auVar23._0_8_ = cam.d.x + dVar18 * cy.x + dVar12 * cx.x;
          auVar23._8_8_ = cam.d.y + dVar18 * cy.y + dVar12 * cx.y;
          dVar12 = dVar22 * dVar22 + auVar23._0_8_ * auVar23._0_8_ + auVar23._8_8_ * auVar23._8_8_;
          if (dVar12 < 0.0) {
            dVar12 = sqrt(dVar12);
          }
          else {
            dVar12 = SQRT(dVar12);
          }
          local_1d0 = dVar22 / dVar12;
          auVar17._8_8_ = dVar12;
          auVar17._0_8_ = dVar12;
          register0x000012c0 = divpd(auVar23,auVar17);
          local_1f8._16_8_ = cam.o.z;
          local_1f8._0_8_ = cam.o.x;
          local_1f8._8_8_ = cam.o.y;
          iVar3 = (int)((long)spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                              super__Vector_impl_data._M_start >> 4) * -0x49249249;
          dVar12 = 1e+20;
          if (iVar3 != 0) {
            lVar9 = (long)iVar3;
            lVar6 = lVar9 * 0x70;
            dVar18 = 1e+20;
            do {
              dVar12 = Sphere::Intersect((Sphere *)
                                         ((long)&spheres.
                                                 super__Vector_base<Sphere,_std::allocator<Sphere>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].c.x +
                                         lVar6),(Ray *)local_1f8);
              if (dVar18 <= dVar12 || dVar12 == 0.0) {
                dVar12 = dVar18;
              }
              lVar9 = lVar9 + -1;
              lVar6 = lVar6 + -0x70;
              dVar18 = dVar12;
            } while (lVar9 != 0);
          }
          if (dVar12 < 1e+20) {
            dVar18 = local_178.first.x -
                     ((double)local_1f8._24_8_ * dVar12 + (double)local_1f8._0_8_);
            dVar22 = local_178.first.y - (dStack_1d8 * dVar12 + (double)local_1f8._8_8_);
            dVar12 = local_178.first.z - (dVar12 * local_1d0 + (double)local_1f8._16_8_);
            dVar25 = local_178.second.x.z * dVar12 +
                     local_178.second.x.x * dVar18 + local_178.second.x.y * dVar22;
            dVar26 = local_178.second.y.z * dVar12 +
                     local_178.second.y.x * dVar18 + local_178.second.y.y * dVar22;
            dVar12 = dVar12 * local_178.second.z.z +
                     dVar18 * local_178.second.z.x + dVar22 * local_178.second.z.y;
            if (useCovFilter == true) {
              dVar19 = dVar26 * dVar26 * local_218;
              dVar18 = dVar25 * dVar25 * local_210;
              dVar25 = (dVar25 + dVar25) * dVar26 * local_220;
              dVar22 = exp(dVar12 * -10.0 * dVar12);
              dVar12 = exp((dVar25 + dVar18 + dVar19) * -0.5);
              dVar12 = dVar12 * dVar22;
LAB_00118db6:
              fVar24 = (float)dVar12;
            }
            else {
              local_1a8 = local_248.y;
              local_1a0 = local_248.x;
              local_230 = local_248.z;
              dVar18 = local_248.z * local_248.z +
                       local_248.x * local_248.x + local_248.y * local_248.y;
              local_228 = dVar26;
              if (dVar18 < 0.0) {
                dVar18 = sqrt(dVar18);
              }
              else {
                dVar18 = SQRT(dVar18);
              }
              local_1c0 = local_268.y;
              local_1b8 = local_268.x;
              local_1b0 = local_268.z;
              dVar22 = local_268.z * local_268.z +
                       local_268.x * local_268.x + local_268.y * local_268.y;
              if (dVar22 < 0.0) {
                local_1c8 = dVar18;
                dVar22 = sqrt(dVar22);
                dVar18 = local_1c8;
              }
              else {
                dVar22 = SQRT(dVar22);
              }
              iVar4 = (int)((local_230 * dVar12 + local_1a0 * dVar25 + local_1a8 * local_228) /
                           dVar18);
              iVar3 = -iVar4;
              if (0 < iVar4) {
                iVar3 = iVar4;
              }
              dVar18 = local_248.z * local_248.z +
                       local_248.x * local_248.x + local_248.y * local_248.y;
              if (dVar18 < 0.0) {
                local_230 = dVar22;
                dVar18 = sqrt(dVar18);
                dVar22 = local_230;
              }
              else {
                dVar18 = SQRT(dVar18);
              }
              fVar24 = 0.0;
              if ((double)iVar3 < dVar18) {
                iVar4 = (int)((local_1b0 * dVar12 + dVar25 * local_1b8 + local_228 * local_1c0) /
                             dVar22);
                iVar3 = -iVar4;
                if (0 < iVar4) {
                  iVar3 = iVar4;
                }
                dVar18 = local_268.z * local_268.z +
                         local_268.x * local_268.x + local_268.y * local_268.y;
                if (dVar18 < 0.0) {
                  dVar18 = sqrt(dVar18);
                }
                else {
                  dVar18 = SQRT(dVar18);
                }
                fVar24 = 0.0;
                if ((double)iVar3 < dVar18) {
                  dVar12 = exp(dVar12 * -10.0 * dVar12);
                  goto LAB_00118db6;
                }
              }
            }
            cov_img[(int)(iVar2 * (iVar1 + ~uVar10) + local_28c)] = fVar24;
          }
          uVar10 = uVar10 + 1;
        } while ((int)uVar10 < width);
      }
      local_28c = local_28c + 1;
    } while (local_28c < height);
  }
  return;
}

Assistant:

void CovarianceTexture(int x, int y) {
   // Generate a covariance matrix at the sampling position
   const auto t = (cx*((x+0.5)/double(width) - .5) + cy*((y+0.5)/double(height) - .5) + cam.d).Normalize();
   //*/
   const auto pixelCov = Cov4D({ 1.0E+5, 0.0, 1.0E+5, 0.0, 0.0, 1.0E+5, 0.0, 0.0, 0.0, 1.0E+5 }, t);
   /*/
   const auto pixelCov = Cov4D({ 1.0E-5, 0.0, 1.0E-5, 0.0, 0.0, 1.0E-5, 0.0, 0.0, 0.0, 1.0E-5 }, t);
   //*/
   sout.str("");
   const auto surfCov  = CovarianceFilter(spheres, Ray(cam.o, t), pixelCov, 0, 1, sout);
   sout << surfCov.second << std::endl;
   sout << "Volume = " << surfCov.second.Volume() << std::endl;
   sout << std::endl;

   double sxx = 0, syy = 0, sxy = 0;
   Vector Dx, Dy;
   try {
      surfCov.second.SpatialFilter(sxx, sxy, syy);
      surfCov.second.SpatialExtent(Dx, Dy);
      sout << "Spatial filter = [" << sxx << "," << sxy << "; " << sxy << ", " << syy << "]"<< std::endl;
      sout << "Extent = " << Dx << ", " << Dy << std::endl;
      sout << "|Dx| = " << Vector::Norm(Dx) << ", |Dy| = " << Vector::Norm(Dy) << std::endl;
   } catch (...) {
      std::cout << "Error: incorrect spatial filter" << std::endl;
      sout << surfCov.second << std::endl;
      return;
   }

   // Loop over the rows and columns of the image and evaluate radiance and
   // covariance per pixel using Monte-Carlo.
   #pragma omp parallel for schedule(dynamic, 1)
   for (int y=0; y<height; y++){
      for (int x=0; x<width; x++) {
         // Pixel index
         int i=(width-x-1)*height+y;

         // Generate the pixel direction
         Vector d = cx*( ( 0.5 + x)/width - .5) +
                    cy*( ( 0.5 + y)/height - .5) + cam.d;
         d.Normalize();

         Ray ray(cam.o, d);
         double t; int id;
         if(!Intersect(spheres, ray, t, id)){ continue; }
         Vector hitp = ray.o + t*ray.d;

         // Evaluate the covariance
         const Vector dx  = surfCov.first - hitp;
         const Vector dU = Vector(Vector::Dot(dx, surfCov.second.x), Vector::Dot(dx, surfCov.second.y), Vector::Dot(dx, surfCov.second.z));
         if(useCovFilter) {
            double bf = dU.x*dU.x*sxx + dU.y*dU.y*syy + 2*dU.x*dU.y*sxy;
            cov_img[i] = exp(-10.0*dU.z*dU.z) * exp(- 0.5* bf);
         } else {

            const double du  = Vector::Dot(dU, Dx) / Vector::Norm(Dx);
            const double dv  = Vector::Dot(dU, Dy) / Vector::Norm(Dy);
            cov_img[i] = (abs(du) < Vector::Norm(Dx) &&
                          abs(dv) < Vector::Norm(Dy)) ? exp(-10.0*dU.z*dU.z) : 0.0;
         }
      }
   }
}